

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_scalar_cell_restart_sol(REF_GRID ref_grid,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  int iVar1;
  REF_STATUS RVar2;
  void *pvVar3;
  long lVar4;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_DBL p;
  REF_DBL v;
  REF_DBL u;
  REF_DBL rho;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT *hits;
  REF_INT nodes [27];
  int local_64;
  int local_60;
  REF_INT cell;
  REF_INT node;
  REF_INT cell_node;
  REF_INT i;
  REF_INT ncell;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)ref_grid->cell[3];
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)scalar;
  scalar_local = (REF_DBL **)ldim;
  ldim_local = (REF_INT *)ref_grid;
  if (ref_node->n < 2) {
    _i = fopen(filename,"r");
    if (_i == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (_i == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xa82,
             "ref_part_scalar_cell_restart_sol","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      *(undefined4 *)scalar_local = 5;
      ref_private_status_reis_bi = 1;
      iVar1 = __isoc99_fscanf(_i,"%d",&cell_node);
      _ref_malloc_init_i_1 = (long)iVar1;
      if (ref_private_status_reis_bi == _ref_malloc_init_i_1) {
        if (cell_node == *(int *)&file->_IO_write_ptr) {
          if (*(int *)scalar_local * ref_cell->last_node_is_an_id < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xa8b,"ref_part_scalar_cell_restart_sol","malloc *scalar of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            pvVar3 = malloc((long)(*(int *)scalar_local * ref_cell->last_node_is_an_id) << 3);
            *(void **)filename_local = pvVar3;
            if (*(long *)filename_local == 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xa8b,"ref_part_scalar_cell_restart_sol","malloc *scalar of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (rho._4_4_ = 0; rho._4_4_ < *(int *)scalar_local * ref_cell->last_node_is_an_id;
                  rho._4_4_ = rho._4_4_ + 1) {
                *(undefined8 *)(*(long *)filename_local + (long)rho._4_4_ * 8) = 0;
              }
              if (ref_cell->last_node_is_an_id < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xa8c,"ref_part_scalar_cell_restart_sol","malloc hits of REF_INT negative");
                ref_grid_local._4_4_ = 1;
              }
              else {
                ref_private_status_reis_ai =
                     (REF_LONG)malloc((long)ref_cell->last_node_is_an_id << 2);
                if ((void *)ref_private_status_reis_ai == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xa8c,"ref_part_scalar_cell_restart_sol","malloc hits of REF_INT NULL");
                  ref_grid_local._4_4_ = 2;
                }
                else {
                  for (rho._0_4_ = 0; rho._0_4_ < ref_cell->last_node_is_an_id;
                      rho._0_4_ = rho._0_4_ + 1) {
                    *(undefined4 *)(ref_private_status_reis_ai + (long)rho._0_4_ * 4) = 0;
                  }
                  for (local_64 = 0; local_64 < *(int *)((long)&file->_IO_write_ptr + 4);
                      local_64 = local_64 + 1) {
                    RVar2 = ref_cell_nodes((REF_CELL)file,local_64,(REF_INT *)&hits);
                    if (RVar2 == 0) {
                      iVar1 = __isoc99_fscanf(_i,"%lf %lf %lf %lf",&u,&v,&p,
                                              &ref_private_status_reis_ai_1);
                      if ((long)iVar1 != 4) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xa91,"ref_part_scalar_cell_restart_sol","cell data read",4,
                               (long)iVar1);
                        return 1;
                      }
                      for (cell = 0; cell < *(int *)((long)&file->_IO_read_ptr + 4); cell = cell + 1
                          ) {
                        *(double *)
                         (*(long *)filename_local +
                         (long)(*(int *)scalar_local * nodes[(long)cell + -2]) * 8) =
                             u + *(double *)
                                  (*(long *)filename_local +
                                  (long)(*(int *)scalar_local * nodes[(long)cell + -2]) * 8);
                        lVar4 = (long)(*(int *)scalar_local * nodes[(long)cell + -2] + 1);
                        *(double *)(*(long *)filename_local + lVar4 * 8) =
                             v + *(double *)(*(long *)filename_local + lVar4 * 8);
                        lVar4 = (long)(*(int *)scalar_local * nodes[(long)cell + -2] + 3);
                        *(double *)(*(long *)filename_local + lVar4 * 8) =
                             p + *(double *)(*(long *)filename_local + lVar4 * 8);
                        lVar4 = (long)(*(int *)scalar_local * nodes[(long)cell + -2] + 4);
                        *(double *)(*(long *)filename_local + lVar4 * 8) =
                             (double)ref_private_status_reis_ai_1 +
                             *(double *)(*(long *)filename_local + lVar4 * 8);
                        *(int *)(ref_private_status_reis_ai + (long)nodes[(long)cell + -2] * 4) =
                             *(int *)(ref_private_status_reis_ai + (long)nodes[(long)cell + -2] * 4)
                             + 1;
                      }
                    }
                  }
                  for (local_60 = 0; local_60 < ref_cell->last_node_is_an_id;
                      local_60 = local_60 + 1) {
                    if (((-1 < local_60) && (local_60 < ref_cell->last_node_is_an_id)) &&
                       (-1 < *(long *)(*(long *)&ref_cell->edge_per + (long)local_60 * 8))) {
                      if (*(int *)(ref_private_status_reis_ai + (long)local_60 * 4) < 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xa9c,"ref_part_scalar_cell_restart_sol","zero hits for node");
                        return 1;
                      }
                      for (node = 0; node < 5; node = node + 1) {
                        lVar4 = (long)(node + *(int *)scalar_local * local_60);
                        *(double *)(*(long *)filename_local + lVar4 * 8) =
                             *(double *)(*(long *)filename_local + lVar4 * 8) /
                             (double)*(int *)(ref_private_status_reis_ai + (long)local_60 * 4);
                      }
                    }
                  }
                  if (ref_private_status_reis_ai != 0) {
                    free((void *)ref_private_status_reis_ai);
                  }
                  iVar1 = fclose(_i);
                  if ((long)iVar1 == 0) {
                    ref_grid_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xaa3,"ref_part_scalar_cell_restart_sol","close file",0,(long)iVar1);
                    ref_grid_local._4_4_ = 1;
                  }
                }
              }
            }
          }
        }
        else {
          printf("file %d ref_cell %d\n",(ulong)(uint)cell_node,(ulong)*(uint *)&file->_IO_write_ptr
                );
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xa88,"ref_part_scalar_cell_restart_sol","ERROR: global count mismatch");
          ref_grid_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xa85,"ref_part_scalar_cell_restart_sol","read ncell",ref_private_status_reis_bi,
               _ref_malloc_init_i_1);
        ref_grid_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xa7e,
           "ref_part_scalar_cell_restart_sol","only implemented for single core");
    ref_grid_local._4_4_ = 1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_scalar_cell_restart_sol(
    REF_GRID ref_grid, REF_INT *ldim, REF_DBL **scalar, const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  FILE *file;
  REF_INT ncell, i, cell_node;
  REF_INT node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *hits;

  RAS(!ref_mpi_para(ref_mpi), "only implemented for single core");

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  *ldim = 5;
  REIS(1, fscanf(file, "%d", &ncell), "read ncell");
  if (ncell != ref_cell_n(ref_cell)) {
    printf("file %d ref_cell %d\n", ncell, ref_cell_n(ref_cell));
    THROW("ERROR: global count mismatch");
  }

  ref_malloc_init(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0.0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_DBL rho, u, v, p;
    REIS(4, fscanf(file, "%lf %lf %lf %lf", &rho, &u, &v, &p),
         "cell data read");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      (*scalar)[0 + (*ldim) * nodes[cell_node]] += rho;
      (*scalar)[1 + (*ldim) * nodes[cell_node]] += u;
      (*scalar)[3 + (*ldim) * nodes[cell_node]] += v;
      (*scalar)[4 + (*ldim) * nodes[cell_node]] += p;
      hits[nodes[cell_node]] += 1;
    }
  }